

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O3

void __thiscall ki::protocol::dml::MessageTemplate::~MessageTemplate(MessageTemplate *this)

{
  Record *this_00;
  pointer pcVar1;
  
  this_00 = this->m_record;
  if (this_00 != (Record *)0x0) {
    ki::dml::Record::~Record(this_00);
  }
  operator_delete(this_00);
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

MessageTemplate::~MessageTemplate()
	{
		delete m_record;
	}